

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O2

int16_t envy_bios_parse_power_fan_calib_model
                  (envy_bios_power_fan_calib_entry *e,uint8_t fan_speed,int16_t *div)

{
  ulong uVar1;
  long lVar2;
  short sVar3;
  short sVar4;
  int iVar5;
  short sVar6;
  short sVar7;
  int iVar8;
  
  uVar1 = 0x149970 / (ulong)e->pwm_freq;
  sVar6 = (short)uVar1;
  *div = sVar6;
  iVar8 = (int)sVar6;
  lVar2 = (long)(e->duty_offset * iVar8) / 0x1000;
  sVar3 = (short)lVar2;
  sVar7 = (short)((int)((uint)e->duty_max * iVar8) / 0x1000) + sVar3;
  sVar4 = sVar6;
  if ((int)sVar3 <= (int)sVar7 && -1 < sVar7) {
    iVar5 = (int)(((int)sVar7 - (int)sVar3) * (uint)fan_speed) / 100 + (int)lVar2;
    sVar4 = (short)iVar5;
    if (sVar4 < iVar8) {
      iVar8 = (int)sVar4;
    }
    if (iVar8 < 0) {
      sVar4 = 0;
    }
    else {
      iVar8 = (int)uVar1;
      iVar5 = iVar5 * 0x10000;
      if (SBORROW4(iVar5,iVar8 * 0x10000) == iVar5 + iVar8 * -0x10000 < 0) {
        sVar4 = sVar6;
      }
    }
  }
  return sVar4;
}

Assistant:

static int16_t
envy_bios_parse_power_fan_calib_model(struct envy_bios_power_fan_calib_entry *e,
                                      uint8_t fan_speed, int16_t *div) {
	int16_t duty_max, duty_offset, high, low, val;

	*div = 1350000 / e->pwm_freq;
	duty_max = *div * e->duty_max / 4096;
	duty_offset = *div * e->duty_offset / 4096;

	/* TODO: Figure out a better algorithm than this one:
	 * def low_model(pwm_freq, duty_offset):
	 *     div = int(13.5e5 / pwm_freq)
	 *     offset = round(div / 2.4889, 0)
	 *     period = math.floor(pwm_freq * 205 / 65536) - 1
	 *     slope = div / 4096
	 *
	 *     if duty_offset == 0:
	 *         return 0
	 *
	 *     o = 0
	 *     if (duty_offset % period) < period / 2.0:
	 *         o = offset
	 *     else:
	 *         o = 1
	 *
	 *     return min(int(duty_offset * slope + o), div)
	 */
	low = duty_offset;

	/* TODO: Figure out the reason for all these off-by-one that can go either
	 * way...
	 */
	high = duty_max + duty_offset;
	if (high < 0 || low > high)
		return *div;

	/* do a linear interpolation between low and high to get the duty cycle
	 * corresponding to the wanted fan speed
	 */
	val = low + fan_speed * (high - low) / 100;

	return MAX(0, MIN(val, *div));
}